

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall
presolve::HPresolve::substituteFreeCol
          (HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt row,HighsInt col,
          bool relaxRowDualBounds)

{
  RowType rowType;
  double rhs;
  RowType local_7c;
  double local_78;
  HighsMatrixSlice<HighsTripletListSlice> local_70;
  HighsMatrixSlice<HighsTripletPositionSlice> local_50;
  
  dualImpliedFreeGetRhsAndRowType(this,row,&local_78,&local_7c,relaxRowDualBounds);
  local_70.nodeValue =
       (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_50.nodeIndex =
       (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_50.nodePositions =
       (this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_50.len = (HighsInt)
                 ((ulong)((long)(this->rowpositions).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_50.nodePositions) >> 2);
  local_70.nodeNext =
       (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_70.nodeIndex =
       (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_70.head =
       (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start[col];
  local_50.nodeValue = local_70.nodeValue;
  HighsPostsolveStack::freeColSubstitution<HighsTripletPositionSlice,HighsTripletListSlice>
            (postsolve_stack,row,col,local_78,
             (this->model->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[col],local_7c,&local_50,&local_70);
  substitute(this,row,col,local_78);
  return;
}

Assistant:

void HPresolve::substituteFreeCol(HighsPostsolveStack& postsolve_stack,
                                  HighsInt row, HighsInt col,
                                  bool relaxRowDualBounds) {
  assert(!rowDeleted[row]);
  assert(!colDeleted[col]);
  assert(isDualImpliedFree(row));
  assert(isImpliedFree(col));

  HighsPostsolveStack::RowType rowType;
  double rhs;
  dualImpliedFreeGetRhsAndRowType(row, rhs, rowType, relaxRowDualBounds);

  postsolve_stack.freeColSubstitution(row, col, rhs, model->col_cost_[col],
                                      rowType, getStoredRow(),
                                      getColumnVector(col));

  // todo, check integrality of coefficients and allow this
  substitute(row, col, rhs);
}